

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  GridSOA *pGVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  long lVar27;
  long lVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  GridSOA *pGVar34;
  ulong uVar35;
  ulong *puVar36;
  GridSOA *pGVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  uint uVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_b58;
  GridSOA *local_ae8;
  ulong local_ae0;
  ulong local_ad8;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  RTCFilterFunctionNArguments local_a60;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  GridSOA **local_8e0;
  char local_8d8;
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar89 = ZEXT1664(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar90 = ZEXT1664(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar91 = ZEXT1664(auVar41);
  auVar39 = vmulss_avx512f(auVar39,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar40 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar42._0_4_ = auVar39._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  uVar31 = auVar40._0_4_;
  auVar39 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar75 = auVar39._0_4_;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar92 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar93 = ZEXT1664(auVar39);
  auVar39._8_4_ = 0x80000000;
  auVar39._0_8_ = 0x8000000080000000;
  auVar39._12_4_ = 0x80000000;
  auVar39 = vxorps_avx512vl(auVar42,auVar39);
  auVar94 = ZEXT1664(auVar39);
  auVar40._0_8_ = CONCAT44(uVar31,uVar31) ^ 0x8000000080000000;
  auVar40._8_4_ = uVar31 ^ 0x80000000;
  auVar40._12_4_ = uVar31 ^ 0x80000000;
  auVar41._0_8_ = CONCAT44(uVar75,uVar75) ^ 0x8000000080000000;
  auVar41._8_4_ = uVar75 ^ 0x80000000;
  auVar41._12_4_ = uVar75 ^ 0x80000000;
  local_a10 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
  local_b58 = local_7f8;
LAB_01ce73a0:
  do {
    puVar36 = local_b58;
    if (puVar36 == &local_800) {
LAB_01ce8110:
      return puVar36 != &local_800;
    }
    local_b58 = puVar36 + -1;
    uVar33 = puVar36[-1];
    while( true ) {
      local_a70 = auVar89._0_16_;
      local_ac0 = auVar94._0_16_;
      local_aa0 = auVar92._0_16_;
      local_a80 = auVar90._0_16_;
      local_a90 = auVar91._0_16_;
      local_ab0 = auVar93._0_16_;
      if ((uVar33 & 8) != 0) break;
      uVar29 = uVar33 & 0xfffffffffffffff0;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar71._4_4_ = uVar7;
      auVar71._0_4_ = uVar7;
      auVar71._8_4_ = uVar7;
      auVar71._12_4_ = uVar7;
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar35),auVar71,
                                *(undefined1 (*) [16])(uVar29 + 0x20 + uVar35));
      auVar42 = vfmadd213ps_avx512vl(auVar39,local_a70,local_ac0);
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar38),auVar71,
                                *(undefined1 (*) [16])(uVar29 + 0x20 + uVar38));
      auVar43 = vmaxps_avx512vl(local_aa0,auVar42);
      auVar42 = vfmadd213ps_avx512vl(auVar39,local_a80,auVar40);
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + uVar30),auVar71,
                                *(undefined1 (*) [16])(uVar29 + 0x20 + uVar30));
      auVar39 = vfmadd213ps_avx512vl(auVar39,local_a90,auVar41);
      auVar39 = vmaxps_avx(auVar42,auVar39);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + (uVar35 ^ 0x10)),auVar71,
                                *(undefined1 (*) [16])(uVar29 + 0x20 + (uVar35 ^ 0x10)));
      auVar39 = vmaxps_avx(auVar43,auVar39);
      auVar43 = vfmadd213ps_avx512vl(auVar42,local_a70,local_ac0);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + (uVar38 ^ 0x10)),auVar71,
                                *(undefined1 (*) [16])(uVar29 + 0x20 + (uVar38 ^ 0x10)));
      auVar43 = vminps_avx512vl(local_ab0,auVar43);
      auVar44 = vfmadd213ps_avx512vl(auVar42,local_a80,auVar40);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar29 + 0x80 + (uVar30 ^ 0x10)),auVar71,
                                *(undefined1 (*) [16])(uVar29 + 0x20 + (uVar30 ^ 0x10)));
      auVar42 = vfmadd213ps_avx512vl(auVar42,local_a90,auVar41);
      auVar42 = vminps_avx(auVar44,auVar42);
      auVar42 = vminps_avx(auVar43,auVar42);
      uVar19 = vcmpps_avx512vl(auVar39,auVar42,2);
      uVar31 = (uint)uVar19;
      if (((uint)uVar33 & 7) == 6) {
        uVar20 = vcmpps_avx512vl(auVar71,*(undefined1 (*) [16])(uVar29 + 0xf0),1);
        uVar21 = vcmpps_avx512vl(auVar71,*(undefined1 (*) [16])(uVar29 + 0xe0),0xd);
        uVar31 = (uint)(byte)((byte)uVar20 & (byte)uVar21 & (byte)uVar19);
      }
      if ((byte)uVar31 == 0) goto LAB_01ce73a0;
      lVar23 = 0;
      for (uVar33 = (ulong)(byte)uVar31; (uVar33 & 1) == 0;
          uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar33 = *(ulong *)(uVar29 + lVar23 * 8);
      uVar31 = (uVar31 & 0xff) - 1 & uVar31 & 0xff;
      uVar32 = (ulong)uVar31;
      if (uVar31 != 0) {
        do {
          *local_b58 = uVar33;
          local_b58 = local_b58 + 1;
          lVar23 = 0;
          for (uVar33 = uVar32; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          uVar33 = *(ulong *)(uVar29 + lVar23 * 8);
        } while (uVar32 != 0);
      }
    }
    if (((uint)uVar33 & 0xf) != 8) {
      uVar29 = *(ulong *)*(GridSOA **)(uVar33 & 0xfffffffffffffff0);
      (pre->super_Precalculations).grid = *(GridSOA **)(uVar33 & 0xfffffffffffffff0);
      if (uVar29 != 0) {
        *local_b58 = uVar29;
        local_b58 = local_b58 + 1;
      }
      goto LAB_01ce73a0;
    }
    pGVar14 = (pre->super_Precalculations).grid;
    uVar31 = *(uint *)(pGVar14 + 0xc);
    local_ae0 = (ulong)uVar31;
    auVar42 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,*(int *)(pGVar14 + 8) + -1);
    fVar18 = auVar42._0_4_ * *(float *)(ray + k * 4 + 0x70);
    auVar39 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),9);
    auVar39 = vminss_avx(auVar39,ZEXT416((uint)(auVar42._0_4_ + -1.0)));
    auVar43 = vmaxss_avx(auVar83._0_16_,auVar39);
    uVar75 = *(uint *)(pGVar14 + 0x10);
    local_ad8 = (ulong)uVar75;
    lVar23 = (long)(int)auVar43._0_4_ * (ulong)*(uint *)(pGVar14 + 0x28) +
             (ulong)*(uint *)(pGVar14 + 0x24);
    uVar33 = uVar33 >> 4;
    lVar27 = uVar33 * 4 + lVar23;
    lVar28 = uVar33 * 4 + lVar23 + 0x2c;
    auVar39 = *(undefined1 (*) [16])(pGVar14 + local_ae0 * 4 + lVar27 + 0x2c);
    auVar42 = auVar39;
    if (2 < local_ad8) {
      auVar42 = *(undefined1 (*) [16])(pGVar14 + local_ae0 * 8 + lVar28);
    }
    auVar44 = *(undefined1 (*) [16])(pGVar14 + uVar33 * 4 + lVar23 + 0x2c);
    if (local_ae0 == 2) {
      auVar44 = vshufps_avx(auVar44,auVar44,0x54);
      auVar39 = vshufps_avx(auVar39,auVar39,0x54);
      auVar42 = vshufps_avx(auVar42,auVar42,0x54);
    }
    uVar33 = (ulong)*(uint *)(pGVar14 + 0x14);
    pGVar34 = pGVar14 + uVar33 * 4 + lVar27 + 0x2c;
    auVar71 = *(undefined1 (*) [16])(pGVar34 + local_ae0 * 4);
    auVar78 = auVar71;
    if (2 < uVar75) {
      auVar78 = *(undefined1 (*) [16])(pGVar34 + local_ae0 * 8);
    }
    auVar8 = *(undefined1 (*) [16])pGVar34;
    if (uVar31 == 2) {
      auVar8 = vshufps_avx(auVar8,auVar8,0x54);
      auVar71 = vshufps_avx(auVar71,auVar71,0x54);
      auVar78 = vshufps_avx(auVar78,auVar78,0x54);
    }
    pGVar37 = pGVar14 + uVar33 * 8 + lVar27 + 0x2c;
    auVar9 = *(undefined1 (*) [16])(pGVar37 + local_ae0 * 4);
    auVar80 = auVar9;
    if (2 < uVar75) {
      auVar80 = *(undefined1 (*) [16])(pGVar37 + local_ae0 * 8);
    }
    auVar10 = *(undefined1 (*) [16])pGVar37;
    if (uVar31 == 2) {
      auVar10 = vshufps_avx(auVar10,auVar10,0x54);
      auVar9 = vshufps_avx(auVar9,auVar9,0x54);
      auVar80 = vshufps_avx(auVar80,auVar80,0x54);
    }
    uVar29 = (ulong)(*(uint *)(pGVar14 + 0x28) & 0xfffffffc);
    auVar11 = *(undefined1 (*) [16])(pGVar14 + local_ae0 * 4 + uVar29 + lVar28);
    auVar86 = auVar11;
    if (2 < uVar75) {
      auVar86 = *(undefined1 (*) [16])(pGVar14 + local_ae0 * 8 + uVar29 + lVar28);
    }
    auVar12 = *(undefined1 (*) [16])(pGVar14 + uVar29 + lVar28);
    if (uVar31 == 2) {
      auVar12 = vshufps_avx(auVar12,auVar12,0x54);
      auVar11 = vshufps_avx(auVar11,auVar11,0x54);
      auVar86 = vshufps_avx(auVar86,auVar86,0x54);
    }
    pGVar34 = pGVar34 + uVar29;
    auVar13 = *(undefined1 (*) [16])(pGVar34 + local_ae0 * 4);
    auVar88 = auVar13;
    if (2 < uVar75) {
      auVar88 = *(undefined1 (*) [16])(pGVar34 + local_ae0 * 8);
    }
    auVar45 = *(undefined1 (*) [16])pGVar34;
    if (uVar31 == 2) {
      auVar45 = vshufps_avx512vl(auVar45,auVar45,0x54);
      auVar13 = vshufps_avx(auVar13,auVar13,0x54);
      auVar88 = vshufps_avx(auVar88,auVar88,0x54);
    }
    pGVar37 = pGVar37 + uVar29;
    auVar46 = *(undefined1 (*) [16])pGVar37;
    auVar47 = *(undefined1 (*) [16])(pGVar37 + local_ae0 * 4);
    auVar48 = auVar47;
    if (2 < uVar75) {
      auVar48 = *(undefined1 (*) [16])(pGVar37 + local_ae0 * 8);
    }
    if (uVar31 == 2) {
      auVar46 = vshufps_avx512vl(auVar46,auVar46,0x54);
      auVar47 = vshufps_avx512vl(auVar47,auVar47,0x54);
      auVar48 = vshufps_avx512vl(auVar48,auVar48,0x54);
    }
    local_ae8 = pGVar14 + uVar33 * 0xc + lVar27 + 0x2c;
    auVar60._16_16_ = auVar39;
    auVar60._0_16_ = auVar44;
    auVar70._16_16_ = auVar42;
    auVar70._0_16_ = auVar39;
    auVar56 = vunpcklps_avx(auVar60,auVar70);
    auVar60 = vshufps_avx(auVar60,auVar60,0xa5);
    auVar70 = vshufps_avx(auVar70,auVar70,0x94);
    auVar59._16_16_ = auVar71;
    auVar59._0_16_ = auVar8;
    auVar69._16_16_ = auVar78;
    auVar69._0_16_ = auVar71;
    auVar58 = vunpcklps_avx(auVar59,auVar69);
    auVar61 = vshufps_avx(auVar59,auVar59,0xa5);
    auVar68 = vshufps_avx(auVar69,auVar69,0x94);
    auVar63._16_16_ = auVar9;
    auVar63._0_16_ = auVar10;
    auVar54._16_16_ = auVar80;
    auVar54._0_16_ = auVar9;
    auVar64 = vunpcklps_avx(auVar63,auVar54);
    auVar59 = vshufps_avx(auVar63,auVar63,0xa5);
    auVar69 = vshufps_avx(auVar54,auVar54,0x94);
    auVar55._16_16_ = auVar11;
    auVar55._0_16_ = auVar12;
    auVar50._16_16_ = auVar86;
    auVar50._0_16_ = auVar11;
    auVar54 = vunpcklps_avx(auVar55,auVar50);
    auVar57 = vshufps_avx(auVar55,auVar55,0xa5);
    auVar62 = vshufps_avx(auVar50,auVar50,0x94);
    auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar13,1);
    auVar51._16_16_ = auVar88;
    auVar51._0_16_ = auVar13;
    auVar55 = vunpcklps_avx(auVar49,auVar51);
    auVar49 = vshufps_avx(auVar49,auVar49,0xa5);
    auVar63 = vshufps_avx(auVar51,auVar51,0x94);
    auVar50 = vinsertf32x4_avx512vl(ZEXT1632(auVar46),auVar47,1);
    auVar51 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar48,1);
    auVar52 = vunpcklps_avx512vl(auVar50,auVar51);
    auVar50 = vshufps_avx512vl(auVar50,auVar50,0xa5);
    auVar51 = vshufps_avx512vl(auVar51,auVar51,0x94);
    auVar39 = ZEXT416((uint)(fVar18 - auVar43._0_4_));
    auVar53 = vbroadcastss_avx512vl(auVar39);
    auVar39 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar39);
    auVar65._0_4_ = auVar39._0_4_;
    auVar65._4_4_ = auVar65._0_4_;
    auVar65._8_4_ = auVar65._0_4_;
    auVar65._12_4_ = auVar65._0_4_;
    auVar65._16_4_ = auVar65._0_4_;
    auVar65._20_4_ = auVar65._0_4_;
    auVar65._24_4_ = auVar65._0_4_;
    auVar65._28_4_ = auVar65._0_4_;
    auVar54 = vmulps_avx512vl(auVar53,auVar54);
    auVar55 = vmulps_avx512vl(auVar53,auVar55);
    auVar52 = vmulps_avx512vl(auVar53,auVar52);
    auVar39 = vfmadd231ps_fma(auVar54,auVar65,auVar56);
    auVar42 = vfmadd231ps_fma(auVar55,auVar65,auVar58);
    auVar56 = vfmadd231ps_avx512vl(auVar52,auVar65,auVar64);
    auVar57 = vmulps_avx512vl(auVar53,auVar57);
    auVar49 = vmulps_avx512vl(auVar53,auVar49);
    auVar58 = vmulps_avx512vl(auVar53,auVar50);
    auVar43 = vfmadd231ps_fma(auVar57,auVar65,auVar60);
    auVar44 = vfmadd231ps_fma(auVar49,auVar65,auVar61);
    auVar59 = vfmadd231ps_avx512vl(auVar58,auVar65,auVar59);
    auVar60 = vmulps_avx512vl(auVar53,auVar62);
    auVar61 = vmulps_avx512vl(auVar53,auVar63);
    auVar57 = vmulps_avx512vl(auVar53,auVar51);
    auVar71 = vfmadd231ps_fma(auVar60,auVar65,auVar70);
    auVar78 = vfmadd231ps_fma(auVar61,auVar65,auVar68);
    uVar7 = *(undefined4 *)(ray + k * 4);
    auVar58._4_4_ = uVar7;
    auVar58._0_4_ = uVar7;
    auVar58._8_4_ = uVar7;
    auVar58._12_4_ = uVar7;
    auVar58._16_4_ = uVar7;
    auVar58._20_4_ = uVar7;
    auVar58._24_4_ = uVar7;
    auVar58._28_4_ = uVar7;
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x10);
    auVar64._4_4_ = uVar7;
    auVar64._0_4_ = uVar7;
    auVar64._8_4_ = uVar7;
    auVar64._12_4_ = uVar7;
    auVar64._16_4_ = uVar7;
    auVar64._20_4_ = uVar7;
    auVar64._24_4_ = uVar7;
    auVar64._28_4_ = uVar7;
    auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar79._4_4_ = uVar7;
    auVar79._0_4_ = uVar7;
    auVar79._8_4_ = uVar7;
    auVar79._12_4_ = uVar7;
    auVar79._16_4_ = uVar7;
    auVar79._20_4_ = uVar7;
    auVar79._24_4_ = uVar7;
    auVar79._28_4_ = uVar7;
    auVar8 = vfmadd231ps_fma(auVar57,auVar65,auVar69);
    uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar81._4_4_ = uVar7;
    auVar81._0_4_ = uVar7;
    auVar81._8_4_ = uVar7;
    auVar81._12_4_ = uVar7;
    auVar81._16_4_ = uVar7;
    auVar81._20_4_ = uVar7;
    auVar81._24_4_ = uVar7;
    auVar81._28_4_ = uVar7;
    fVar18 = *(float *)(ray + k * 4 + 0x60);
    auVar85._4_4_ = fVar18;
    auVar85._0_4_ = fVar18;
    auVar85._8_4_ = fVar18;
    auVar85._12_4_ = fVar18;
    auVar85._16_4_ = fVar18;
    auVar85._20_4_ = fVar18;
    auVar85._24_4_ = fVar18;
    auVar85._28_4_ = fVar18;
    auVar60 = vsubps_avx(ZEXT1632(auVar39),auVar58);
    auVar70 = vsubps_avx(ZEXT1632(auVar42),auVar64);
    auVar63 = vsubps_avx512vl(auVar56,auVar62);
    in_ZMM10 = ZEXT3264(auVar63);
    auVar61 = vsubps_avx(ZEXT1632(auVar43),auVar58);
    auVar49 = vsubps_avx512vl(ZEXT1632(auVar44),auVar64);
    auVar56 = vsubps_avx512vl(auVar59,auVar62);
    auVar68 = vsubps_avx(ZEXT1632(auVar71),auVar58);
    auVar58 = vsubps_avx512vl(ZEXT1632(auVar78),auVar64);
    auVar64 = vsubps_avx512vl(ZEXT1632(auVar8),auVar62);
    auVar59 = vsubps_avx(auVar68,auVar60);
    auVar54 = vsubps_avx512vl(auVar58,auVar70);
    auVar55 = vsubps_avx512vl(auVar64,auVar63);
    auVar50 = vsubps_avx512vl(auVar60,auVar61);
    auVar51 = vsubps_avx512vl(auVar70,auVar49);
    auVar52 = vsubps_avx512vl(auVar63,auVar56);
    auVar69 = vsubps_avx(auVar61,auVar68);
    auVar53 = vsubps_avx512vl(auVar49,auVar58);
    auVar65 = vsubps_avx512vl(auVar56,auVar64);
    auVar72._0_4_ = auVar68._0_4_ + auVar60._0_4_;
    auVar72._4_4_ = auVar68._4_4_ + auVar60._4_4_;
    auVar72._8_4_ = auVar68._8_4_ + auVar60._8_4_;
    auVar72._12_4_ = auVar68._12_4_ + auVar60._12_4_;
    auVar72._16_4_ = auVar68._16_4_ + auVar60._16_4_;
    auVar72._20_4_ = auVar68._20_4_ + auVar60._20_4_;
    auVar72._24_4_ = auVar68._24_4_ + auVar60._24_4_;
    auVar72._28_4_ = auVar68._28_4_ + auVar60._28_4_;
    auVar62 = vaddps_avx512vl(auVar58,auVar70);
    auVar57 = vaddps_avx512vl(auVar64,auVar63);
    auVar66 = vmulps_avx512vl(auVar62,auVar55);
    auVar66 = vfmsub231ps_avx512vl(auVar66,auVar54,auVar57);
    auVar57 = vmulps_avx512vl(auVar57,auVar59);
    auVar67 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar72);
    auVar57._4_4_ = auVar54._4_4_ * auVar72._4_4_;
    auVar57._0_4_ = auVar54._0_4_ * auVar72._0_4_;
    auVar57._8_4_ = auVar54._8_4_ * auVar72._8_4_;
    auVar57._12_4_ = auVar54._12_4_ * auVar72._12_4_;
    auVar57._16_4_ = auVar54._16_4_ * auVar72._16_4_;
    auVar57._20_4_ = auVar54._20_4_ * auVar72._20_4_;
    auVar57._24_4_ = auVar54._24_4_ * auVar72._24_4_;
    auVar57._28_4_ = auVar72._28_4_;
    auVar39 = vfmsub231ps_fma(auVar57,auVar59,auVar62);
    auVar73._0_4_ = fVar18 * auVar39._0_4_;
    auVar73._4_4_ = fVar18 * auVar39._4_4_;
    auVar73._8_4_ = fVar18 * auVar39._8_4_;
    auVar73._12_4_ = fVar18 * auVar39._12_4_;
    auVar73._16_4_ = fVar18 * 0.0;
    auVar73._20_4_ = fVar18 * 0.0;
    auVar73._24_4_ = fVar18 * 0.0;
    auVar73._28_4_ = 0;
    auVar57 = vfmadd231ps_avx512vl(auVar73,auVar81,auVar67);
    local_940 = vfmadd231ps_avx512vl(auVar57,auVar79,auVar66);
    auVar74._0_4_ = auVar61._0_4_ + auVar60._0_4_;
    auVar74._4_4_ = auVar61._4_4_ + auVar60._4_4_;
    auVar74._8_4_ = auVar61._8_4_ + auVar60._8_4_;
    auVar74._12_4_ = auVar61._12_4_ + auVar60._12_4_;
    auVar74._16_4_ = auVar61._16_4_ + auVar60._16_4_;
    auVar74._20_4_ = auVar61._20_4_ + auVar60._20_4_;
    auVar74._24_4_ = auVar61._24_4_ + auVar60._24_4_;
    auVar74._28_4_ = auVar61._28_4_ + auVar60._28_4_;
    auVar57 = vaddps_avx512vl(auVar70,auVar49);
    auVar62 = vaddps_avx512vl(auVar63,auVar56);
    auVar66 = vmulps_avx512vl(auVar57,auVar52);
    auVar66 = vfmsub231ps_avx512vl(auVar66,auVar51,auVar62);
    auVar62 = vmulps_avx512vl(auVar62,auVar50);
    auVar67 = vfmsub231ps_avx512vl(auVar62,auVar52,auVar74);
    auVar62 = vmulps_avx512vl(auVar74,auVar51);
    auVar57 = vfmsub231ps_avx512vl(auVar62,auVar50,auVar57);
    auVar62._4_4_ = fVar18 * auVar57._4_4_;
    auVar62._0_4_ = fVar18 * auVar57._0_4_;
    auVar62._8_4_ = fVar18 * auVar57._8_4_;
    auVar62._12_4_ = fVar18 * auVar57._12_4_;
    auVar62._16_4_ = fVar18 * auVar57._16_4_;
    auVar62._20_4_ = fVar18 * auVar57._20_4_;
    auVar62._24_4_ = fVar18 * auVar57._24_4_;
    auVar62._28_4_ = auVar57._28_4_;
    auVar57 = vfmadd231ps_avx512vl(auVar62,auVar81,auVar67);
    local_920 = vfmadd231ps_avx512vl(auVar57,auVar79,auVar66);
    auVar66._0_4_ = auVar61._0_4_ + auVar68._0_4_;
    auVar66._4_4_ = auVar61._4_4_ + auVar68._4_4_;
    auVar66._8_4_ = auVar61._8_4_ + auVar68._8_4_;
    auVar66._12_4_ = auVar61._12_4_ + auVar68._12_4_;
    auVar66._16_4_ = auVar61._16_4_ + auVar68._16_4_;
    auVar66._20_4_ = auVar61._20_4_ + auVar68._20_4_;
    auVar66._24_4_ = auVar61._24_4_ + auVar68._24_4_;
    auVar66._28_4_ = auVar61._28_4_ + auVar68._28_4_;
    auVar61 = vaddps_avx512vl(auVar49,auVar58);
    auVar68 = vaddps_avx512vl(auVar56,auVar64);
    auVar57 = vmulps_avx512vl(auVar61,auVar65);
    auVar57 = vfmsub231ps_avx512vl(auVar57,auVar53,auVar68);
    auVar68 = vmulps_avx512vl(auVar68,auVar69);
    auVar68 = vfmsub231ps_avx512vl(auVar68,auVar65,auVar66);
    auVar49._4_4_ = auVar66._4_4_ * auVar53._4_4_;
    auVar49._0_4_ = auVar66._0_4_ * auVar53._0_4_;
    auVar49._8_4_ = auVar66._8_4_ * auVar53._8_4_;
    auVar49._12_4_ = auVar66._12_4_ * auVar53._12_4_;
    auVar49._16_4_ = auVar66._16_4_ * auVar53._16_4_;
    auVar49._20_4_ = auVar66._20_4_ * auVar53._20_4_;
    auVar49._24_4_ = auVar66._24_4_ * auVar53._24_4_;
    auVar49._28_4_ = auVar66._28_4_;
    auVar39 = vfmsub231ps_fma(auVar49,auVar69,auVar61);
    auVar61 = vmulps_avx512vl(ZEXT1632(auVar39),auVar85);
    auVar61 = vfmadd231ps_avx512vl(auVar61,auVar81,auVar68);
    auVar57 = vfmadd231ps_avx512vl(auVar61,auVar79,auVar57);
    auVar56._0_4_ = local_940._0_4_ + local_920._0_4_;
    auVar56._4_4_ = local_940._4_4_ + local_920._4_4_;
    auVar56._8_4_ = local_940._8_4_ + local_920._8_4_;
    auVar56._12_4_ = local_940._12_4_ + local_920._12_4_;
    auVar56._16_4_ = local_940._16_4_ + local_920._16_4_;
    auVar56._20_4_ = local_940._20_4_ + local_920._20_4_;
    auVar56._24_4_ = local_940._24_4_ + local_920._24_4_;
    auVar56._28_4_ = local_940._28_4_ + local_920._28_4_;
    local_900 = vaddps_avx512vl(auVar57,auVar56);
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    vandps_avx512vl(local_900,auVar62);
    auVar61._8_4_ = 0x34000000;
    auVar61._0_8_ = 0x3400000034000000;
    auVar61._12_4_ = 0x34000000;
    auVar61._16_4_ = 0x34000000;
    auVar61._20_4_ = 0x34000000;
    auVar61._24_4_ = 0x34000000;
    auVar61._28_4_ = 0x34000000;
    auVar61 = vmulps_avx512vl(auVar62,auVar61);
    auVar68 = vminps_avx512vl(local_940,local_920);
    auVar49 = vminps_avx512vl(auVar68,auVar57);
    auVar68._8_4_ = 0x80000000;
    auVar68._0_8_ = 0x8000000080000000;
    auVar68._12_4_ = 0x80000000;
    auVar68._16_4_ = 0x80000000;
    auVar68._20_4_ = 0x80000000;
    auVar68._24_4_ = 0x80000000;
    auVar68._28_4_ = 0x80000000;
    auVar68 = vxorps_avx512vl(auVar61,auVar68);
    uVar19 = vcmpps_avx512vl(auVar49,auVar68,5);
    auVar68 = vmaxps_avx512vl(local_940,local_920);
    auVar68 = vmaxps_avx512vl(auVar68,auVar57);
    uVar20 = vcmpps_avx512vl(auVar68,auVar61,2);
    bVar22 = (byte)uVar19 | (byte)uVar20;
    if (bVar22 == 0) {
LAB_01ce8009:
      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar61 = vmulps_avx512vl(auVar51,auVar55);
      auVar68 = vmulps_avx512vl(auVar59,auVar52);
      auVar57 = vmulps_avx512vl(auVar50,auVar54);
      auVar49 = vmulps_avx512vl(auVar53,auVar52);
      auVar56 = vmulps_avx512vl(auVar50,auVar65);
      auVar58 = vmulps_avx512vl(auVar69,auVar51);
      auVar64 = vfmsub213ps_avx512vl(auVar54,auVar52,auVar61);
      auVar54 = vfmsub213ps_avx512vl(auVar55,auVar50,auVar68);
      auVar59 = vfmsub213ps_avx512vl(auVar59,auVar51,auVar57);
      auVar55 = vfmsub213ps_avx512vl(auVar65,auVar51,auVar49);
      auVar69 = vfmsub213ps_avx512vl(auVar69,auVar52,auVar56);
      auVar50 = vfmsub213ps_avx512vl(auVar53,auVar50,auVar58);
      vandps_avx512vl(auVar61,auVar62);
      vandps_avx512vl(auVar49,auVar62);
      uVar33 = vcmpps_avx512vl(auVar50,auVar50,1);
      vandps_avx512vl(auVar68,auVar62);
      vandps_avx512vl(auVar56,auVar62);
      uVar29 = vcmpps_avx512vl(auVar50,auVar50,1);
      vandps_avx512vl(auVar57,auVar62);
      vandps_avx512vl(auVar58,auVar62);
      uVar32 = vcmpps_avx512vl(auVar50,auVar50,1);
      bVar17 = (bool)((byte)uVar33 & 1);
      local_860._0_4_ = (uint)bVar17 * auVar64._0_4_ | (uint)!bVar17 * auVar55._0_4_;
      bVar17 = (bool)((byte)(uVar33 >> 1) & 1);
      local_860._4_4_ = (uint)bVar17 * auVar64._4_4_ | (uint)!bVar17 * auVar55._4_4_;
      bVar17 = (bool)((byte)(uVar33 >> 2) & 1);
      local_860._8_4_ = (uint)bVar17 * auVar64._8_4_ | (uint)!bVar17 * auVar55._8_4_;
      bVar17 = (bool)((byte)(uVar33 >> 3) & 1);
      local_860._12_4_ = (uint)bVar17 * auVar64._12_4_ | (uint)!bVar17 * auVar55._12_4_;
      bVar17 = (bool)((byte)(uVar33 >> 4) & 1);
      local_860._16_4_ = (uint)bVar17 * auVar64._16_4_ | (uint)!bVar17 * auVar55._16_4_;
      bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
      local_860._20_4_ = (uint)bVar17 * auVar64._20_4_ | (uint)!bVar17 * auVar55._20_4_;
      bVar17 = (bool)((byte)(uVar33 >> 6) & 1);
      local_860._24_4_ = (uint)bVar17 * auVar64._24_4_ | (uint)!bVar17 * auVar55._24_4_;
      bVar17 = SUB81(uVar33 >> 7,0);
      local_860._28_4_ = (uint)bVar17 * auVar64._28_4_ | (uint)!bVar17 * auVar55._28_4_;
      bVar17 = (bool)((byte)uVar29 & 1);
      local_840._0_4_ = (uint)bVar17 * auVar54._0_4_ | (uint)!bVar17 * auVar69._0_4_;
      bVar17 = (bool)((byte)(uVar29 >> 1) & 1);
      local_840._4_4_ = (uint)bVar17 * auVar54._4_4_ | (uint)!bVar17 * auVar69._4_4_;
      bVar17 = (bool)((byte)(uVar29 >> 2) & 1);
      local_840._8_4_ = (uint)bVar17 * auVar54._8_4_ | (uint)!bVar17 * auVar69._8_4_;
      bVar17 = (bool)((byte)(uVar29 >> 3) & 1);
      local_840._12_4_ = (uint)bVar17 * auVar54._12_4_ | (uint)!bVar17 * auVar69._12_4_;
      bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
      local_840._16_4_ = (uint)bVar17 * auVar54._16_4_ | (uint)!bVar17 * auVar69._16_4_;
      bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
      local_840._20_4_ = (uint)bVar17 * auVar54._20_4_ | (uint)!bVar17 * auVar69._20_4_;
      bVar17 = (bool)((byte)(uVar29 >> 6) & 1);
      local_840._24_4_ = (uint)bVar17 * auVar54._24_4_ | (uint)!bVar17 * auVar69._24_4_;
      bVar17 = SUB81(uVar29 >> 7,0);
      local_840._28_4_ = (uint)bVar17 * auVar54._28_4_ | (uint)!bVar17 * auVar69._28_4_;
      bVar17 = (bool)((byte)uVar32 & 1);
      local_820._0_4_ = (float)((uint)bVar17 * auVar59._0_4_ | (uint)!bVar17 * auVar50._0_4_);
      bVar17 = (bool)((byte)(uVar32 >> 1) & 1);
      local_820._4_4_ = (float)((uint)bVar17 * auVar59._4_4_ | (uint)!bVar17 * auVar50._4_4_);
      bVar17 = (bool)((byte)(uVar32 >> 2) & 1);
      local_820._8_4_ = (float)((uint)bVar17 * auVar59._8_4_ | (uint)!bVar17 * auVar50._8_4_);
      bVar17 = (bool)((byte)(uVar32 >> 3) & 1);
      local_820._12_4_ = (float)((uint)bVar17 * auVar59._12_4_ | (uint)!bVar17 * auVar50._12_4_);
      bVar17 = (bool)((byte)(uVar32 >> 4) & 1);
      local_820._16_4_ = (float)((uint)bVar17 * auVar59._16_4_ | (uint)!bVar17 * auVar50._16_4_);
      bVar17 = (bool)((byte)(uVar32 >> 5) & 1);
      local_820._20_4_ = (float)((uint)bVar17 * auVar59._20_4_ | (uint)!bVar17 * auVar50._20_4_);
      bVar17 = (bool)((byte)(uVar32 >> 6) & 1);
      local_820._24_4_ = (float)((uint)bVar17 * auVar59._24_4_ | (uint)!bVar17 * auVar50._24_4_);
      bVar17 = SUB81(uVar32 >> 7,0);
      local_820._28_4_ = (uint)bVar17 * auVar59._28_4_ | (uint)!bVar17 * auVar50._28_4_;
      auVar67._4_4_ = fVar18 * local_820._4_4_;
      auVar67._0_4_ = fVar18 * local_820._0_4_;
      auVar67._8_4_ = fVar18 * local_820._8_4_;
      auVar67._12_4_ = fVar18 * local_820._12_4_;
      auVar67._16_4_ = fVar18 * local_820._16_4_;
      auVar67._20_4_ = fVar18 * local_820._20_4_;
      auVar67._24_4_ = fVar18 * local_820._24_4_;
      auVar67._28_4_ = fVar18;
      auVar39 = vfmadd213ps_fma(auVar81,local_840,auVar67);
      auVar39 = vfmadd213ps_fma(auVar79,local_860,ZEXT1632(auVar39));
      auVar61 = ZEXT1632(CONCAT412(auVar39._12_4_ + auVar39._12_4_,
                                   CONCAT48(auVar39._8_4_ + auVar39._8_4_,
                                            CONCAT44(auVar39._4_4_ + auVar39._4_4_,
                                                     auVar39._0_4_ + auVar39._0_4_))));
      auVar82._0_4_ = auVar63._0_4_ * local_820._0_4_;
      auVar82._4_4_ = auVar63._4_4_ * local_820._4_4_;
      auVar82._8_4_ = auVar63._8_4_ * local_820._8_4_;
      auVar82._12_4_ = auVar63._12_4_ * local_820._12_4_;
      auVar82._16_4_ = auVar63._16_4_ * local_820._16_4_;
      auVar82._20_4_ = auVar63._20_4_ * local_820._20_4_;
      auVar82._24_4_ = auVar63._24_4_ * local_820._24_4_;
      auVar82._28_4_ = 0;
      auVar39 = vfmadd213ps_fma(auVar70,local_840,auVar82);
      auVar42 = vfmadd213ps_fma(auVar60,local_860,ZEXT1632(auVar39));
      auVar60 = vrcp14ps_avx512vl(auVar61);
      auVar52._8_4_ = 0x3f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._12_4_ = 0x3f800000;
      auVar52._16_4_ = 0x3f800000;
      auVar52._20_4_ = 0x3f800000;
      auVar52._24_4_ = 0x3f800000;
      auVar52._28_4_ = 0x3f800000;
      auVar70 = vfnmadd213ps_avx512vl(auVar60,auVar61,auVar52);
      auVar39 = vfmadd132ps_fma(auVar70,auVar60,auVar60);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_a00._4_4_ = uVar7;
      local_a00._0_4_ = uVar7;
      local_a00._8_4_ = uVar7;
      local_a00._12_4_ = uVar7;
      local_a00._16_4_ = uVar7;
      local_a00._20_4_ = uVar7;
      local_a00._24_4_ = uVar7;
      local_a00._28_4_ = uVar7;
      auVar87 = ZEXT3264(local_a00);
      local_880 = ZEXT1632(CONCAT412(auVar39._12_4_ * (auVar42._12_4_ + auVar42._12_4_),
                                     CONCAT48(auVar39._8_4_ * (auVar42._8_4_ + auVar42._8_4_),
                                              CONCAT44(auVar39._4_4_ *
                                                       (auVar42._4_4_ + auVar42._4_4_),
                                                       auVar39._0_4_ *
                                                       (auVar42._0_4_ + auVar42._0_4_)))));
      uVar19 = vcmpps_avx512vl(local_880,local_a00,2);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar53._4_4_ = uVar7;
      auVar53._0_4_ = uVar7;
      auVar53._8_4_ = uVar7;
      auVar53._12_4_ = uVar7;
      auVar53._16_4_ = uVar7;
      auVar53._20_4_ = uVar7;
      auVar53._24_4_ = uVar7;
      auVar53._28_4_ = uVar7;
      uVar20 = vcmpps_avx512vl(local_880,auVar53,0xd);
      bVar22 = (byte)uVar19 & (byte)uVar20 & bVar22;
      if (bVar22 == 0) goto LAB_01ce8009;
      uVar33 = vcmpps_avx512vl(auVar61,ZEXT832(0) << 0x20,4);
      uVar33 = bVar22 & uVar33;
      local_8d8 = (char)uVar33;
      if (local_8d8 == '\0') goto LAB_01ce8009;
      local_8e0 = &local_ae8;
      pGVar15 = (context->scene->geometries).items[*(uint *)(pGVar14 + 0x18)].ptr;
      if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01ce8009;
      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
         (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01ce8104:
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_01ce8110;
      }
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      auVar24._16_4_ = 0x219392ef;
      auVar24._20_4_ = 0x219392ef;
      auVar24._24_4_ = 0x219392ef;
      auVar24._28_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar62,auVar24,5);
      auVar39 = *(undefined1 (*) [16])(local_ae8 + local_ae0 * 4);
      auVar42 = auVar39;
      if (2 < local_ad8) {
        auVar42 = *(undefined1 (*) [16])(local_ae8 + local_ae0 * 8);
      }
      auVar43 = *(undefined1 (*) [16])local_ae8;
      if (local_ae0 == 2) {
        auVar43 = vpshufd_avx(auVar43,0x54);
        auVar39 = vpshufd_avx(auVar39,0x54);
        auVar42 = vpshufd_avx(auVar42,0x54);
      }
      auVar83 = ZEXT864(0) << 0x20;
      auVar60 = vrcp14ps_avx512vl(local_900);
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar84._16_4_ = 0x3f800000;
      auVar84._20_4_ = 0x3f800000;
      auVar84._24_4_ = 0x3f800000;
      auVar84._28_4_ = 0x3f800000;
      in_ZMM10 = ZEXT3264(auVar84);
      auVar44 = vfnmadd213ps_fma(local_900,auVar60,auVar84);
      auVar60 = vfmadd132ps_avx512vl(ZEXT1632(auVar44),auVar60,auVar60);
      fVar1 = (float)((uint)((byte)uVar29 & 1) * auVar60._0_4_);
      fVar18 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar60._4_4_);
      fVar2 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar60._8_4_);
      fVar3 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar60._12_4_);
      fVar4 = (float)((uint)((byte)(uVar29 >> 4) & 1) * auVar60._16_4_);
      fVar5 = (float)((uint)((byte)(uVar29 >> 5) & 1) * auVar60._20_4_);
      fVar6 = (float)((uint)((byte)(uVar29 >> 6) & 1) * auVar60._24_4_);
      auVar25._4_4_ = local_940._4_4_ * fVar18;
      auVar25._0_4_ = local_940._0_4_ * fVar1;
      auVar25._8_4_ = local_940._8_4_ * fVar2;
      auVar25._12_4_ = local_940._12_4_ * fVar3;
      auVar25._16_4_ = local_940._16_4_ * fVar4;
      auVar25._20_4_ = local_940._20_4_ * fVar5;
      auVar25._24_4_ = local_940._24_4_ * fVar6;
      auVar25._28_4_ = local_940._28_4_;
      auVar57 = vminps_avx(auVar25,auVar84);
      auVar26._4_4_ = fVar18 * local_920._4_4_;
      auVar26._0_4_ = fVar1 * local_920._0_4_;
      auVar26._8_4_ = fVar2 * local_920._8_4_;
      auVar26._12_4_ = fVar3 * local_920._12_4_;
      auVar26._16_4_ = fVar4 * local_920._16_4_;
      auVar26._20_4_ = fVar5 * local_920._20_4_;
      auVar26._24_4_ = fVar6 * local_920._24_4_;
      auVar26._28_4_ = local_920._28_4_;
      auVar62 = vminps_avx(auVar26,auVar84);
      auVar76._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar43;
      auVar76._16_16_ = ZEXT116(1) * auVar39;
      auVar77._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar39;
      auVar77._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
      auVar60 = vpunpckldq_avx2(auVar76,auVar77);
      auVar61 = vpshufd_avx2(auVar76,0xa5);
      auVar59 = vpshufd_avx2(auVar77,0x94);
      auVar70 = vpsrld_avx2(auVar60,0x10);
      auVar60 = vpblendw_avx2(auVar60,ZEXT832(0) << 0x20,0xaa);
      auVar60 = vcvtdq2ps_avx(auVar60);
      auVar70 = vcvtdq2ps_avx(auVar70);
      auVar68 = vpsrld_avx2(auVar61,0x10);
      auVar61 = vpblendw_avx2(auVar61,ZEXT832(0) << 0x20,0xaa);
      auVar61 = vcvtdq2ps_avx(auVar61);
      auVar68 = vcvtdq2ps_avx(auVar68);
      auVar69 = vpsrld_avx2(auVar59,0x10);
      auVar59 = vpblendw_avx2(auVar59,ZEXT832(0) << 0x20,0xaa);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar69 = vcvtdq2ps_avx(auVar69);
      auVar49 = vsubps_avx(auVar84,auVar57);
      auVar49 = vsubps_avx(auVar49,auVar62);
      local_8c0._0_4_ =
           auVar62._0_4_ * auVar59._0_4_ * 0.00012207031 +
           auVar57._0_4_ * auVar61._0_4_ * 0.00012207031 +
           auVar49._0_4_ * auVar60._0_4_ * 0.00012207031;
      local_8c0._4_4_ =
           auVar62._4_4_ * auVar59._4_4_ * 0.00012207031 +
           auVar57._4_4_ * auVar61._4_4_ * 0.00012207031 +
           auVar49._4_4_ * auVar60._4_4_ * 0.00012207031;
      local_8c0._8_4_ =
           auVar62._8_4_ * auVar59._8_4_ * 0.00012207031 +
           auVar57._8_4_ * auVar61._8_4_ * 0.00012207031 +
           auVar49._8_4_ * auVar60._8_4_ * 0.00012207031;
      local_8c0._12_4_ =
           auVar62._12_4_ * auVar59._12_4_ * 0.00012207031 +
           auVar57._12_4_ * auVar61._12_4_ * 0.00012207031 +
           auVar49._12_4_ * auVar60._12_4_ * 0.00012207031;
      local_8c0._16_4_ =
           auVar62._16_4_ * auVar59._16_4_ * 0.00012207031 +
           auVar57._16_4_ * auVar61._16_4_ * 0.00012207031 +
           auVar49._16_4_ * auVar60._16_4_ * 0.00012207031;
      local_8c0._20_4_ =
           auVar62._20_4_ * auVar59._20_4_ * 0.00012207031 +
           auVar57._20_4_ * auVar61._20_4_ * 0.00012207031 +
           auVar49._20_4_ * auVar60._20_4_ * 0.00012207031;
      local_8c0._24_4_ =
           auVar62._24_4_ * auVar59._24_4_ * 0.00012207031 +
           auVar57._24_4_ * auVar61._24_4_ * 0.00012207031 +
           auVar49._24_4_ * auVar60._24_4_ * 0.00012207031;
      local_8c0._28_4_ = auVar59._28_4_ + auVar61._28_4_ + auVar62._28_4_;
      local_8a0[0] = auVar62._0_4_ * auVar69._0_4_ * 0.00012207031 +
                     auVar57._0_4_ * auVar68._0_4_ * 0.00012207031 +
                     auVar49._0_4_ * auVar70._0_4_ * 0.00012207031;
      local_8a0[1] = auVar62._4_4_ * auVar69._4_4_ * 0.00012207031 +
                     auVar57._4_4_ * auVar68._4_4_ * 0.00012207031 +
                     auVar49._4_4_ * auVar70._4_4_ * 0.00012207031;
      local_8a0[2] = auVar62._8_4_ * auVar69._8_4_ * 0.00012207031 +
                     auVar57._8_4_ * auVar68._8_4_ * 0.00012207031 +
                     auVar49._8_4_ * auVar70._8_4_ * 0.00012207031;
      local_8a0[3] = auVar62._12_4_ * auVar69._12_4_ * 0.00012207031 +
                     auVar57._12_4_ * auVar68._12_4_ * 0.00012207031 +
                     auVar49._12_4_ * auVar70._12_4_ * 0.00012207031;
      fStack_890 = auVar62._16_4_ * auVar69._16_4_ * 0.00012207031 +
                   auVar57._16_4_ * auVar68._16_4_ * 0.00012207031 +
                   auVar49._16_4_ * auVar70._16_4_ * 0.00012207031;
      fStack_88c = auVar62._20_4_ * auVar69._20_4_ * 0.00012207031 +
                   auVar57._20_4_ * auVar68._20_4_ * 0.00012207031 +
                   auVar49._20_4_ * auVar70._20_4_ * 0.00012207031;
      fStack_888 = auVar62._24_4_ * auVar69._24_4_ * 0.00012207031 +
                   auVar57._24_4_ * auVar68._24_4_ * 0.00012207031 +
                   auVar49._24_4_ * auVar70._24_4_ * 0.00012207031;
      fStack_884 = auVar59._28_4_ + auVar68._28_4_ + auVar49._28_4_;
      uVar29 = 0;
      for (uVar32 = uVar33; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
        uVar29 = uVar29 + 1;
      }
      local_a20 = vpbroadcastd_avx512vl();
      local_a30 = vpbroadcastd_avx512vl();
      while (uVar33 != 0) {
        fVar18 = local_8a0[uVar29 - 8];
        local_9a0._4_4_ = fVar18;
        local_9a0._0_4_ = fVar18;
        local_9a0._8_4_ = fVar18;
        local_9a0._12_4_ = fVar18;
        fVar18 = local_8a0[uVar29];
        local_990._4_4_ = fVar18;
        local_990._0_4_ = fVar18;
        local_990._8_4_ = fVar18;
        local_990._12_4_ = fVar18;
        *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + uVar29 * 4);
        local_a60.context = context->user;
        local_9d0 = *(undefined4 *)(local_860 + uVar29 * 4);
        uVar7 = *(undefined4 *)(local_840 + uVar29 * 4);
        local_9c0._4_4_ = uVar7;
        local_9c0._0_4_ = uVar7;
        local_9c0._8_4_ = uVar7;
        local_9c0._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_820 + uVar29 * 4);
        local_9b0._4_4_ = uVar7;
        local_9b0._0_4_ = uVar7;
        local_9b0._8_4_ = uVar7;
        local_9b0._12_4_ = uVar7;
        local_980 = local_a30._0_8_;
        uStack_978 = local_a30._8_8_;
        local_970 = local_a20;
        vpcmpeqd_avx2(ZEXT1632(local_a20),ZEXT1632(local_a20));
        uStack_95c = (local_a60.context)->instID[0];
        local_960 = uStack_95c;
        uStack_958 = uStack_95c;
        uStack_954 = uStack_95c;
        uStack_950 = (local_a60.context)->instPrimID[0];
        uStack_94c = uStack_950;
        uStack_948 = uStack_950;
        uStack_944 = uStack_950;
        local_ad0 = local_a10;
        local_a60.valid = (int *)local_ad0;
        local_a60.geometryUserPtr = pGVar15->userPtr;
        local_a60.hit = (RTCHitN *)&local_9d0;
        local_a60.N = 4;
        local_a60.ray = (RTCRayN *)ray;
        uStack_9cc = local_9d0;
        uStack_9c8 = local_9d0;
        uStack_9c4 = local_9d0;
        if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
          in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
          (*pGVar15->occlusionFilterN)(&local_a60);
          auVar87 = ZEXT3264(local_a00);
          auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar94 = ZEXT1664(local_ac0);
          auVar93 = ZEXT1664(local_ab0);
          auVar92 = ZEXT1664(local_aa0);
          auVar91 = ZEXT1664(local_a90);
          auVar90 = ZEXT1664(local_a80);
          auVar89 = ZEXT1664(local_a70);
        }
        uVar32 = vptestmd_avx512vl(local_ad0,local_ad0);
        if ((uVar32 & 0xf) != 0) {
          p_Var16 = context->args->filter;
          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            (*p_Var16)(&local_a60);
            auVar87 = ZEXT3264(local_a00);
            auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar94 = ZEXT1664(local_ac0);
            auVar93 = ZEXT1664(local_ab0);
            auVar92 = ZEXT1664(local_aa0);
            auVar91 = ZEXT1664(local_a90);
            auVar90 = ZEXT1664(local_a80);
            auVar89 = ZEXT1664(local_a70);
          }
          auVar39 = *(undefined1 (*) [16])(local_a60.ray + 0x80);
          uVar32 = vptestmd_avx512vl(local_ad0,local_ad0);
          uVar32 = uVar32 & 0xf;
          auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          bVar17 = (bool)((byte)uVar32 & 1);
          auVar43._0_4_ = (uint)bVar17 * auVar42._0_4_ | (uint)!bVar17 * auVar39._0_4_;
          bVar17 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar43._4_4_ = (uint)bVar17 * auVar42._4_4_ | (uint)!bVar17 * auVar39._4_4_;
          bVar17 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar43._8_4_ = (uint)bVar17 * auVar42._8_4_ | (uint)!bVar17 * auVar39._8_4_;
          bVar17 = SUB81(uVar32 >> 3,0);
          auVar43._12_4_ = (uint)bVar17 * auVar42._12_4_ | (uint)!bVar17 * auVar39._12_4_;
          *(undefined1 (*) [16])(local_a60.ray + 0x80) = auVar43;
          if ((byte)uVar32 != 0) goto LAB_01ce8104;
        }
        *(int *)(ray + k * 4 + 0x80) = auVar87._0_4_;
        uVar32 = uVar29 & 0x3f;
        uVar29 = 0;
        uVar33 = uVar33 ^ 1L << uVar32;
        for (uVar32 = uVar33; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
          uVar29 = uVar29 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }